

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O0

void pyramid_addCombineMove
               (MovePack *movePack,SPOTTYPE spot1,uchar spot1Index,SPOTTYPE spot2,uchar spot2Index)

{
  MovePack *pMVar1;
  MovePack *subPack;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffcc;
  MovePack *movePack_00;
  undefined8 in_stack_ffffffffffffffd8;
  undefined2 uVar3;
  undefined8 in_stack_ffffffffffffffe0;
  int in_stack_fffffffffffffff0;
  
  uVar3 = (undefined2)((ulong)in_stack_ffffffffffffffd8 >> 0x30);
  pMVar1 = movePack_create();
  uVar2 = 0xffffffff;
  movePack_00 = pMVar1;
  move_create((MOVETYPE)((ulong)in_stack_ffffffffffffffe0 >> 0x38),
              (SPOTTYPE)((ulong)in_stack_ffffffffffffffe0 >> 0x30),
              (uchar)((ulong)in_stack_ffffffffffffffe0 >> 0x28),(int)in_stack_ffffffffffffffe0,
              (SPOTTYPE)((ushort)uVar3 >> 8),(uchar)uVar3,in_stack_fffffffffffffff0);
  movePack_add(movePack_00,(Move *)CONCAT44(in_stack_ffffffffffffffcc,uVar2));
  uVar2 = 0xffffffff;
  move_create((MOVETYPE)((ulong)in_stack_ffffffffffffffe0 >> 0x38),
              (SPOTTYPE)((ulong)in_stack_ffffffffffffffe0 >> 0x30),
              (uchar)((ulong)in_stack_ffffffffffffffe0 >> 0x28),(int)in_stack_ffffffffffffffe0,
              (SPOTTYPE)((ulong)pMVar1 >> 0x38),(uchar)((ulong)pMVar1 >> 0x30),
              in_stack_fffffffffffffff0);
  movePack_add(movePack_00,(Move *)CONCAT44(in_stack_ffffffffffffffcc,uVar2));
  move_createMultiple(movePack_00);
  movePack_add(movePack_00,(Move *)CONCAT44(in_stack_ffffffffffffffcc,uVar2));
  return;
}

Assistant:

void pyramid_addCombineMove(MovePack * movePack, SPOTTYPE spot1, unsigned char spot1Index, SPOTTYPE spot2, unsigned char spot2Index)
{
	MovePack * subPack = movePack_create();
	movePack_add(subPack, move_create(MOVE, spot1, spot1Index, -1, FOUNDATION, 0, -1));
	movePack_add(subPack, move_create(MOVE, spot2, spot2Index, -1, FOUNDATION, 0, -1));
	movePack_add(movePack, move_createMultiple(subPack));
}